

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O0

FT_Bool tt_face_get_color_glyph_clipbox(TT_Face face,FT_UInt base_glyph,FT_ClipBox *clip_box)

{
  Colr *colr_00;
  FT_Byte *pFVar1;
  void *pvVar2;
  FT_ULong FVar3;
  FT_Bool FVar4;
  FT_Int32 FVar5;
  ulong uVar6;
  byte *pbVar7;
  FT_Int32 local_f8;
  FT_Int32 local_f4;
  FT_ItemVarDelta item_deltas [4];
  FT_ULong var_index_base;
  FT_BBox font_clip_box;
  FT_Byte j;
  FT_Vector corners [4];
  FT_Byte num_corners;
  FT_Byte format;
  FT_UInt32 clip_box_offset;
  FT_UShort gid_end;
  FT_UShort gid_start;
  FT_ULong i;
  FT_ULong num_clip_boxes;
  FT_Byte clip_list_format;
  FT_Byte *limit;
  FT_Byte *clip_base;
  FT_Byte *p1;
  FT_Byte *p;
  Colr *colr;
  FT_ClipBox *clip_box_local;
  FT_UInt base_glyph_local;
  TT_Face face_local;
  
  corners[3].y._6_1_ = 4;
  colr_00 = (Colr *)face->colr;
  if ((colr_00 != (Colr *)0x0) && (colr_00->clip_list != (FT_Byte *)0x0)) {
    pFVar1 = colr_00->clip_list;
    pvVar2 = colr_00->table;
    FVar3 = colr_00->table_size;
    if ((pFVar1 <= (FT_Byte *)((long)pvVar2 + (FVar3 - 5))) && (*pFVar1 == '\x01')) {
      uVar6 = (ulong)((uint)pFVar1[1] << 0x18 | (uint)pFVar1[2] << 0x10 | (uint)pFVar1[3] << 8 |
                     (uint)pFVar1[4]);
      if ((uVar6 <= colr_00->table_size / 7) &&
         (pFVar1 + 5 <= (FT_Byte *)((long)pvVar2 + uVar6 * -7 + FVar3))) {
        p1 = pFVar1 + 5;
        for (_clip_box_offset = 0; _clip_box_offset < uVar6; _clip_box_offset = _clip_box_offset + 1
            ) {
          if ((CONCAT11(*p1,p1[1]) <= base_glyph) && (base_glyph <= CONCAT11(p1[2],p1[3]))) {
            pbVar7 = pFVar1 + ((uint)p1[4] << 0x10 | (uint)p1[5] << 8 | (uint)p1[6]);
            if ((byte *)((long)pvVar2 + (FVar3 - 1)) < pbVar7) {
              return '\0';
            }
            corners[3].y._7_1_ = *pbVar7;
            if (2 < corners[3].y._7_1_) {
              return '\0';
            }
            if ((byte *)((long)pvVar2 + (FVar3 - 8)) < pbVar7 + 1) {
              return '\0';
            }
            FVar5 = FT_MulFix_x86_64((int)CONCAT11(pbVar7[1],pbVar7[2]),
                                     (FT_Int32)(((face->root).size)->metrics).x_scale);
            var_index_base = (FT_ULong)FVar5;
            FVar5 = FT_MulFix_x86_64((int)CONCAT11(pbVar7[3],pbVar7[4]),
                                     (FT_Int32)(((face->root).size)->metrics).y_scale);
            font_clip_box.xMin = (FT_Pos)FVar5;
            FVar5 = FT_MulFix_x86_64((int)CONCAT11(pbVar7[5],pbVar7[6]),
                                     (FT_Int32)(((face->root).size)->metrics).x_scale);
            font_clip_box.yMin = (FT_Pos)FVar5;
            FVar5 = FT_MulFix_x86_64((int)CONCAT11(pbVar7[7],pbVar7[8]),
                                     (FT_Int32)(((face->root).size)->metrics).y_scale);
            font_clip_box.xMax = (FT_Pos)FVar5;
            if (corners[3].y._7_1_ == 2) {
              item_deltas[2] = 0;
              item_deltas[3] = 0;
              memset(&local_f8,0,0x10);
              if ((byte *)((long)pvVar2 + (FVar3 - 4)) < pbVar7 + 9) {
                return '\0';
              }
              item_deltas._8_8_ =
                   ZEXT48((uint)pbVar7[9] << 0x18 | (uint)pbVar7[10] << 0x10 |
                          (uint)pbVar7[0xb] << 8 | (uint)pbVar7[0xc]);
              FVar4 = get_deltas_for_var_index_base(face,colr_00,item_deltas._8_8_,4,&local_f8);
              if (FVar4 == '\0') {
                return '\0';
              }
              FVar5 = FT_MulFix_x86_64(local_f8,(FT_Int32)(((face->root).size)->metrics).x_scale);
              var_index_base = (long)FVar5 + var_index_base;
              FVar5 = FT_MulFix_x86_64(local_f4,(FT_Int32)(((face->root).size)->metrics).y_scale);
              font_clip_box.xMin = FVar5 + font_clip_box.xMin;
              FVar5 = FT_MulFix_x86_64(item_deltas[0],
                                       (FT_Int32)(((face->root).size)->metrics).x_scale);
              font_clip_box.yMin = FVar5 + font_clip_box.yMin;
              FVar5 = FT_MulFix_x86_64(item_deltas[1],
                                       (FT_Int32)(((face->root).size)->metrics).y_scale);
              font_clip_box.xMax = FVar5 + font_clip_box.xMax;
            }
            corners[0].y = var_index_base;
            corners[1].y = font_clip_box.yMin;
            corners[2].y = font_clip_box.yMin;
            corners[0].x = font_clip_box.xMin;
            corners[1].x = font_clip_box.xMax;
            corners[2].x = font_clip_box.xMax;
            corners[3].x = font_clip_box.xMin;
            for (font_clip_box.yMax._7_1_ = 0; font_clip_box.yMax._7_1_ < 4;
                font_clip_box.yMax._7_1_ = font_clip_box.yMax._7_1_ + 1) {
              if ((((face->root).internal)->transform_flags & 1U) != 0) {
                FT_Vector_Transform((FT_Vector *)&corners[(ulong)font_clip_box.yMax._7_1_ - 1].y,
                                    &((face->root).internal)->transform_matrix);
              }
              if ((((face->root).internal)->transform_flags & 2U) != 0) {
                corners[(ulong)font_clip_box.yMax._7_1_ - 1].y =
                     (((face->root).internal)->transform_delta).x +
                     corners[(ulong)font_clip_box.yMax._7_1_ - 1].y;
                corners[font_clip_box.yMax._7_1_].x =
                     (((face->root).internal)->transform_delta).y +
                     corners[font_clip_box.yMax._7_1_].x;
              }
            }
            (clip_box->bottom_left).x = var_index_base;
            (clip_box->bottom_left).y = corners[0].x;
            (clip_box->top_left).x = corners[0].y;
            (clip_box->top_left).y = corners[1].x;
            (clip_box->top_right).x = corners[1].y;
            (clip_box->top_right).y = corners[2].x;
            (clip_box->bottom_right).x = corners[2].y;
            (clip_box->bottom_right).y = corners[3].x;
            return '\x01';
          }
          p1 = p1 + 7;
        }
      }
    }
  }
  return '\0';
}

Assistant:

FT_LOCAL_DEF( FT_Bool )
  tt_face_get_color_glyph_clipbox( TT_Face      face,
                                   FT_UInt      base_glyph,
                                   FT_ClipBox*  clip_box )
  {
    Colr*  colr;

    FT_Byte  *p, *p1, *clip_base, *limit;

    FT_Byte    clip_list_format;
    FT_ULong   num_clip_boxes, i;
    FT_UShort  gid_start, gid_end;
    FT_UInt32  clip_box_offset;
    FT_Byte    format;

    const FT_Byte  num_corners = 4;
    FT_Vector      corners[4];
    FT_Byte        j;
    FT_BBox        font_clip_box;


    colr = (Colr*)face->colr;
    if ( !colr )
      return 0;

    if ( !colr->clip_list )
      return 0;

    p = colr->clip_list;

    /* Limit points to the first byte after the end of the color table.    */
    /* Thus, in subsequent limit checks below we need to check whether the */
    /* read pointer is strictly greater than a position offset by certain  */
    /* field sizes to the left of that position.                           */
    limit = (FT_Byte*)colr->table + colr->table_size;

    /* Check whether we can extract one `uint8` and one `uint32`. */
    if ( p > limit - ( 1 + 4 ) )
      return 0;

    clip_base        = p;
    clip_list_format = FT_NEXT_BYTE ( p );

    /* Format byte used here to be able to upgrade ClipList for >16bit */
    /* glyph ids; for now we can expect it to be 1.                    */
    if ( !( clip_list_format == 1 ) )
      return 0;

    num_clip_boxes = FT_NEXT_ULONG( p );

    /* Check whether we can extract two `uint16` and one `Offset24`, */
    /* `num_clip_boxes` times.                                       */
    if ( colr->table_size / ( 2 + 2 + 3 ) < num_clip_boxes ||
         p > limit - ( 2 + 2 + 3 ) * num_clip_boxes        )
      return 0;

    for ( i = 0; i < num_clip_boxes; ++i )
    {
      gid_start       = FT_NEXT_USHORT( p );
      gid_end         = FT_NEXT_USHORT( p );
      clip_box_offset = FT_NEXT_UOFF3( p );

      if ( base_glyph >= gid_start && base_glyph <= gid_end )
      {
        p1 = (FT_Byte*)( clip_base + clip_box_offset );

        /* Check whether we can extract one `uint8`. */
        if ( p1 > limit - 1 )
          return 0;

        format = FT_NEXT_BYTE( p1 );

        if ( format > 2 )
          return 0;

        /* Check whether we can extract four `FWORD`. */
        if ( p1 > limit - ( 2 + 2 + 2 + 2 ) )
          return 0;

        /* `face->root.size->metrics.x_scale` and `y_scale` are factors   */
        /* that scale a font unit value in integers to a 26.6 fixed value */
        /* according to the requested size, see for example               */
        /* `ft_recompute_scaled_metrics`.                                 */
        font_clip_box.xMin = FT_MulFix( FT_NEXT_SHORT( p1 ),
                                        face->root.size->metrics.x_scale );
        font_clip_box.yMin = FT_MulFix( FT_NEXT_SHORT( p1 ),
                                        face->root.size->metrics.y_scale );
        font_clip_box.xMax = FT_MulFix( FT_NEXT_SHORT( p1 ),
                                        face->root.size->metrics.x_scale );
        font_clip_box.yMax = FT_MulFix( FT_NEXT_SHORT( p1 ),
                                        face->root.size->metrics.y_scale );

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
        if ( format == 2 )
        {
          FT_ULong         var_index_base = 0;
          /* varIndexBase offset for clipbox is 3 at most. */
          FT_ItemVarDelta  item_deltas[4] = { 0, 0, 0, 0 };


          /* Check whether we can extract a 32-bit varIndexBase now. */
          if ( p1 > limit - 4 )
            return 0;

          var_index_base = FT_NEXT_ULONG( p1 );

          if ( !get_deltas_for_var_index_base( face, colr, var_index_base, 4,
                                               item_deltas ) )
            return 0;

          font_clip_box.xMin +=
            FT_MulFix( item_deltas[0], face->root.size->metrics.x_scale );
          font_clip_box.yMin +=
            FT_MulFix( item_deltas[1], face->root.size->metrics.y_scale );
          font_clip_box.xMax +=
            FT_MulFix( item_deltas[2], face->root.size->metrics.x_scale );
          font_clip_box.yMax +=
            FT_MulFix( item_deltas[3], face->root.size->metrics.y_scale );
        }
#endif

        /* Make 4 corner points (xMin, yMin), (xMax, yMax) and transform */
        /* them.  If we we would only transform two corner points and    */
        /* span a rectangle based on those, the rectangle may become too */
        /* small to cover the glyph.                                     */
        corners[0].x = font_clip_box.xMin;
        corners[1].x = font_clip_box.xMin;
        corners[2].x = font_clip_box.xMax;
        corners[3].x = font_clip_box.xMax;

        corners[0].y = font_clip_box.yMin;
        corners[1].y = font_clip_box.yMax;
        corners[2].y = font_clip_box.yMax;
        corners[3].y = font_clip_box.yMin;

        for ( j = 0; j < num_corners; ++j )
        {
          if ( face->root.internal->transform_flags & 1 )
            FT_Vector_Transform( &corners[j],
                                 &face->root.internal->transform_matrix );

          if ( face->root.internal->transform_flags & 2 )
          {
            corners[j].x += face->root.internal->transform_delta.x;
            corners[j].y += face->root.internal->transform_delta.y;
          }
        }

        clip_box->bottom_left  = corners[0];
        clip_box->top_left     = corners[1];
        clip_box->top_right    = corners[2];
        clip_box->bottom_right = corners[3];

        return 1;
      }
    }

    return 0;
  }